

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkvalgrind.cpp
# Opt level: O1

bool QBenchmarkValgrindUtils::runCallgrindSubProcess(QStringList *origAppArgs,int *exitCode)

{
  QString *pQVar1;
  Data *pDVar2;
  int *piVar3;
  QArrayData *pQVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  QBenchmarkGlobalData *pQVar7;
  char cVar8;
  undefined1 uVar9;
  int iVar10;
  QString *data;
  qint64 pid;
  ulong uVar11;
  long lVar12;
  long in_FS_OFFSET;
  QLatin1String QVar13;
  QStringView QVar14;
  QArrayData *d;
  QArrayData *local_e8;
  undefined1 *puStack_e0;
  QArrayDataPointer<QString> local_d8;
  QString local_b8;
  char16_t *local_a0 [2];
  qsizetype local_90 [2];
  char16_t *local_80;
  undefined8 local_78;
  Data *local_70;
  char16_t *local_68;
  qsizetype local_60;
  undefined8 local_58;
  char16_t *local_50;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (origAppArgs->d).ptr;
  local_d8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.d.d = (Data *)0x0;
  local_b8.d.ptr = L"--tool=callgrind";
  local_b8.d.size = 0x10;
  local_a0[0] = (char16_t *)0x0;
  local_a0[1] = L"--instr-atstart=yes";
  local_90[0] = 0x13;
  local_90[1] = 0;
  local_80 = L"--quiet";
  local_78 = 7;
  local_70 = (pQVar1->d).d;
  local_68 = (pQVar1->d).ptr;
  local_60 = (pQVar1->d).size;
  if (local_70 != (Data *)0x0) {
    LOCK();
    (local_70->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (local_70->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_58 = 0;
  local_50 = L"-callgrindchild";
  local_48 = 0xf;
  local_e8 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.ptr = (QString *)QArrayData::allocate(&local_e8,0x18,0x10,5,KeepSize);
  local_d8.d = (Data *)local_e8;
  local_d8.size = 0;
  uVar11 = 0xffffffffffffffe8;
  do {
    pDVar2 = *(Data **)((long)local_a0 + uVar11);
    local_d8.ptr[local_d8.size].d.d = pDVar2;
    local_d8.ptr[local_d8.size].d.ptr = *(char16_t **)((long)local_a0 + uVar11 + 8);
    local_d8.ptr[local_d8.size].d.size = *(qsizetype *)((long)local_90 + uVar11);
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_d8.size = local_d8.size + 1;
    uVar11 = uVar11 + 0x18;
  } while (uVar11 < 0x60);
  lVar12 = 0x60;
  do {
    piVar3 = *(int **)((long)&local_b8.d.d + lVar12);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        QArrayData::deallocate(*(QArrayData **)((long)&local_b8.d.d + lVar12),2,0x10);
      }
    }
    lVar12 = lVar12 + -0x18;
  } while (lVar12 != -0x18);
  if (1 < (ulong)(origAppArgs->d).size) {
    uVar11 = 1;
    lVar12 = 0x18;
    do {
      pQVar1 = (origAppArgs->d).ptr;
      if (*(long *)((long)&(pQVar1->d).size + lVar12) == 10) {
        QVar13.m_data = "-callgrind";
        QVar13.m_size = 10;
        QVar14.m_data = *(storage_type_conflict **)((long)&(pQVar1->d).ptr + lVar12);
        QVar14.m_size = 10;
        cVar8 = QtPrivate::equalStrings(QVar14,QVar13);
        if (cVar8 == '\0') goto LAB_00152867;
      }
      else {
LAB_00152867:
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)&local_d8,local_d8.size,
                   (QString *)((long)&(pQVar1->d).d + lVar12));
        QList<QString>::end((QList<QString> *)&local_d8);
      }
      uVar11 = uVar11 + 1;
      lVar12 = lVar12 + 0x18;
    } while (uVar11 < (ulong)(origAppArgs->d).size);
  }
  local_e8 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
  QProcess::QProcess((QProcess *)&local_e8,(QObject *)0x0);
  local_b8.d.d = (Data *)0x0;
  local_b8.d.ptr = L"valgrind";
  local_b8.d.size = 8;
  QProcess::start(&local_e8,&local_b8,&local_d8,3);
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
    }
  }
  QProcess::waitForStarted((int)&local_e8);
  pid = QProcess::processId();
  outFileBase(&local_b8,pid);
  pQVar7 = QBenchmarkGlobalData::current;
  pQVar4 = &((QBenchmarkGlobalData::current->callgrindOutFileBase).d.d)->super_QArrayData;
  pcVar5 = (QBenchmarkGlobalData::current->callgrindOutFileBase).d.ptr;
  (QBenchmarkGlobalData::current->callgrindOutFileBase).d.d = local_b8.d.d;
  (pQVar7->callgrindOutFileBase).d.ptr = local_b8.d.ptr;
  qVar6 = (pQVar7->callgrindOutFileBase).d.size;
  (pQVar7->callgrindOutFileBase).d.size = local_b8.d.size;
  local_b8.d.d = (Data *)pQVar4;
  local_b8.d.ptr = pcVar5;
  local_b8.d.size = qVar6;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,2,0x10);
    }
  }
  uVar9 = QProcess::waitForFinished((int)&local_e8);
  iVar10 = QProcess::exitCode();
  *exitCode = iVar10;
  QProcess::readAllStandardOutput();
  dumpOutput((QByteArray *)&local_b8,_stdout);
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,1,0x10);
    }
  }
  QProcess::readAllStandardError();
  dumpOutput((QByteArray *)&local_b8,_stderr);
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,1,0x10);
    }
  }
  QProcess::~QProcess((QProcess *)&local_e8);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_d8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)uVar9;
  }
  __stack_chk_fail();
}

Assistant:

bool QBenchmarkValgrindUtils::runCallgrindSubProcess(const QStringList &origAppArgs, int &exitCode)
{
    const QString &execFile = origAppArgs.at(0);
    QStringList args{ u"--tool=callgrind"_s, u"--instr-atstart=yes"_s,
                      u"--quiet"_s, execFile, u"-callgrindchild"_s };

    // pass on original arguments that make sense (e.g. avoid wasting time producing output
    // that will be ignored anyway) ...
    for (int i = 1; i < origAppArgs.size(); ++i) {
        const QString &arg = origAppArgs.at(i);
        if (arg == "-callgrind"_L1)
            continue;
        args << arg; // ok to pass on
    }

    QProcess process;
    process.start(u"valgrind"_s, args);
    process.waitForStarted(-1);
    QBenchmarkGlobalData::current->callgrindOutFileBase =
        QBenchmarkValgrindUtils::outFileBase(process.processId());
    const bool finishedOk = process.waitForFinished(-1);
    exitCode = process.exitCode();

    dumpOutput(process.readAllStandardOutput(), stdout);
    dumpOutput(process.readAllStandardError(), stderr);

    return finishedOk;
}